

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O3

void __thiscall
gtest_suite_FlatBlockEstimatorTest_::ExtractBlock<BitDepthParams<unsigned_short,_8,_true>_>::
TestBody(ExtractBlock<BitDepthParams<unsigned_short,_8,_true>_> *this)

{
  pointer puVar1;
  short sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer puVar6;
  long lVar7;
  double dVar8;
  long lVar9;
  pointer *__ptr;
  SEARCH_METHODS *pSVar10;
  undefined1 auVar11 [16];
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long lVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  undefined4 in_stack_ffffffffffffff5c;
  internal in_stack_ffffffffffffff60;
  internal iVar36;
  undefined1 uVar37;
  undefined6 in_stack_ffffffffffffff62;
  double *in_stack_ffffffffffffff68;
  double *abs_error_expr;
  double *pdVar38;
  AssertHelper local_90;
  long local_88;
  double *local_80;
  VecType *this_00;
  double val1;
  aom_flat_block_finder_t flat_block_finder;
  
  iVar35 = 1;
  local_90.data_._0_4_ = aom_flat_block_finder_init(&flat_block_finder,0x10,8,1);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&stack0xffffffffffffff60,"1",
             "aom_flat_block_finder_init(&flat_block_finder, kBlockSize, this->kBitDepth, this->kUseHighBD)"
             ,(int *)&stack0xffffffffffffff58,(int *)&local_90);
  if (in_stack_ffffffffffffff60 == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffff58);
    if (in_stack_ffffffffffffff68 == (double *)0x0) {
      pSVar10 = "";
    }
    else {
      pSVar10 = (SEARCH_METHODS *)*in_stack_ffffffffffffff68;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
               ,0x17e,(char *)pSVar10);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&stack0xffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT44(in_stack_ffffffffffffff5c,iVar35) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff5c,iVar35) + 8))();
    }
    if (in_stack_ffffffffffffff68 == (double *)0x0) {
      return;
    }
    if ((double *)*in_stack_ffffffffffffff68 != in_stack_ffffffffffffff68 + 2) {
      operator_delete((double *)*in_stack_ffffffffffffff68);
    }
  }
  else {
    abs_error_expr = in_stack_ffffffffffffff68;
    if (in_stack_ffffffffffffff68 != (double *)0x0) {
      if ((double *)*in_stack_ffffffffffffff68 != in_stack_ffffffffffffff68 + 2) {
        operator_delete((double *)*in_stack_ffffffffffffff68);
      }
      operator_delete(in_stack_ffffffffffffff68);
    }
    this_00 = &(this->super_FlatBlockEstimatorTest<BitDepthParams<unsigned_short,_8,_true>_>).data_;
    iVar36 = (internal)0x80;
    uVar37 = 0;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (this_00,0x400,(value_type_conflict4 *)&stack0xffffffffffffff60);
    auVar5 = _DAT_00c231a0;
    auVar4 = _DAT_00c23190;
    auVar3 = _DAT_00c23180;
    puVar6 = (this->super_FlatBlockEstimatorTest<BitDepthParams<unsigned_short,_8,_true>_>).data_.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start + 0x10;
    lVar7 = 0;
    do {
      auVar17._8_4_ = (int)lVar7;
      auVar17._0_8_ = lVar7;
      auVar17._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar9 = -0x10;
      lVar19 = 0;
      lVar20 = 1;
      lVar14 = 2;
      lVar15 = 3;
      lVar25 = 4;
      lVar26 = 5;
      lVar12 = 6;
      lVar13 = 7;
      do {
        sVar2 = (short)lVar7;
        lVar18 = auVar17._8_8_;
        auVar27._0_4_ = (int)(short)((short)lVar19 - sVar2);
        auVar27._4_4_ = (int)(short)((short)lVar20 - sVar2);
        auVar27._8_4_ = (int)(short)((short)lVar14 - sVar2);
        auVar27._12_4_ = (int)(short)((short)lVar15 - sVar2);
        auVar32._0_4_ = (int)(short)((short)lVar25 - sVar2);
        auVar32._4_4_ = (int)(short)((short)lVar26 - sVar2);
        auVar32._8_4_ = (int)(short)((short)lVar12 - sVar2);
        auVar32._12_4_ = (int)(short)((short)lVar13 - sVar2);
        auVar28 = packssdw(auVar27,auVar32);
        puVar1 = puVar6 + lVar9;
        *puVar1 = auVar28._0_2_ + 0x80;
        puVar1[1] = auVar28._2_2_ + 0x80;
        puVar1[2] = auVar28._4_2_ + 0x80;
        puVar1[3] = auVar28._6_2_ + 0x80;
        puVar1[4] = auVar28._8_2_ + 0x80;
        puVar1[5] = auVar28._10_2_ + 0x80;
        puVar1[6] = auVar28._12_2_ + 0x80;
        puVar1[7] = auVar28._14_2_ + 0x80;
        auVar21._0_8_ = lVar19 + lVar7;
        auVar21._8_8_ = lVar20 + lVar18;
        auVar29._0_8_ = lVar14 + lVar7;
        auVar29._8_8_ = lVar15 + lVar18;
        auVar33._0_8_ = lVar25 + lVar7;
        auVar33._8_8_ = lVar26 + lVar18;
        auVar28._0_8_ = lVar12 + lVar7;
        auVar28._8_8_ = lVar13 + lVar18;
        auVar28 = auVar28 & auVar3;
        auVar33 = auVar33 & auVar3;
        auVar29 = auVar29 & auVar3;
        auVar21 = auVar21 & auVar3;
        auVar22._0_4_ = -(uint)(auVar21._0_4_ == 0);
        auVar22._4_4_ = -(uint)(auVar21._4_4_ == 0);
        auVar22._8_4_ = -(uint)(auVar21._8_4_ == 0);
        auVar22._12_4_ = -(uint)(auVar21._12_4_ == 0);
        auVar16._4_4_ = auVar22._0_4_;
        auVar16._0_4_ = auVar22._4_4_;
        auVar16._8_4_ = auVar22._12_4_;
        auVar16._12_4_ = auVar22._8_4_;
        auVar30._0_4_ = -(uint)(auVar29._0_4_ == 0);
        auVar30._4_4_ = -(uint)(auVar29._4_4_ == 0);
        auVar30._8_4_ = -(uint)(auVar29._8_4_ == 0);
        auVar30._12_4_ = -(uint)(auVar29._12_4_ == 0);
        auVar23._4_4_ = auVar30._0_4_;
        auVar23._0_4_ = auVar30._4_4_;
        auVar23._8_4_ = auVar30._12_4_;
        auVar23._12_4_ = auVar30._8_4_;
        auVar16 = packssdw(auVar16 & auVar22,auVar23 & auVar30);
        auVar34._0_4_ = -(uint)(auVar33._0_4_ == 0);
        auVar34._4_4_ = -(uint)(auVar33._4_4_ == 0);
        auVar34._8_4_ = -(uint)(auVar33._8_4_ == 0);
        auVar34._12_4_ = -(uint)(auVar33._12_4_ == 0);
        auVar24._4_4_ = auVar34._0_4_;
        auVar24._0_4_ = auVar34._4_4_;
        auVar24._8_4_ = auVar34._12_4_;
        auVar24._12_4_ = auVar34._8_4_;
        auVar11._0_4_ = -(uint)(auVar28._0_4_ == 0);
        auVar11._4_4_ = -(uint)(auVar28._4_4_ == 0);
        auVar11._8_4_ = -(uint)(auVar28._8_4_ == 0);
        auVar11._12_4_ = -(uint)(auVar28._12_4_ == 0);
        auVar31._4_4_ = auVar11._0_4_;
        auVar31._0_4_ = auVar11._4_4_;
        auVar31._8_4_ = auVar11._12_4_;
        auVar31._12_4_ = auVar11._8_4_;
        auVar28 = packssdw(auVar24 & auVar34,auVar31 & auVar11);
        auVar28 = packssdw(auVar16,auVar28);
        *(undefined1 (*) [16])(puVar6 + lVar9 + 0x10) = auVar28 & auVar5 | ~auVar28 & auVar4;
        lVar19 = lVar19 + 8;
        lVar20 = lVar20 + 8;
        lVar14 = lVar14 + 8;
        lVar15 = lVar15 + 8;
        lVar25 = lVar25 + 8;
        lVar26 = lVar26 + 8;
        lVar12 = lVar12 + 8;
        lVar13 = lVar13 + 8;
        lVar9 = lVar9 + 8;
      } while (lVar9 != 0);
      lVar7 = lVar7 + 1;
      puVar6 = puVar6 + 0x20;
    } while (lVar7 != 0x10);
    in_stack_ffffffffffffff68 = (double *)operator_new(0x800);
    lVar7 = 0;
    do {
      in_stack_ffffffffffffff68[lVar7] = 1.0;
      (in_stack_ffffffffffffff68 + lVar7)[1] = 1.0;
      lVar7 = lVar7 + 2;
    } while (lVar7 != 0x100);
    local_80 = (double *)operator_new(0x800);
    lVar7 = 0;
    do {
      local_80[lVar7] = 1.0;
      (local_80 + lVar7)[1] = 1.0;
      lVar7 = lVar7 + 2;
    } while (lVar7 != 0x100);
    aom_flat_block_finder_extract_block
              (&flat_block_finder,
               (uint8_t *)
               (this_00->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
               _M_impl.super__Vector_impl_data._M_start,0x20,0x20,0x20,0,0,local_80,
               in_stack_ffffffffffffff68);
    local_88 = 0;
    dVar8 = 0.0;
    val1 = flat_block_finder.normalization;
    do {
      lVar7 = 0;
      do {
        testing::internal::DoubleNearPredFormat
                  ((char *)CONCAT62(in_stack_ffffffffffffff62,CONCAT11(uVar37,iVar36)),
                   (char *)CONCAT44(in_stack_ffffffffffffff5c,iVar35),(char *)abs_error_expr,val1,
                   dVar8,(double)this_00);
        if (iVar36 == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffff58);
          pSVar10 = "";
          if (abs_error_expr != (double *)0x0) {
            pSVar10 = (SEARCH_METHODS *)*abs_error_expr;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                     ,0x19b,(char *)pSVar10);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&stack0xffffffffffffff58);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if ((long *)CONCAT44(in_stack_ffffffffffffff5c,iVar35) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff5c,iVar35) + 8))();
          }
        }
        pdVar38 = abs_error_expr;
        if (abs_error_expr != (double *)0x0) {
          if ((double *)*abs_error_expr != abs_error_expr + 2) {
            operator_delete((double *)*abs_error_expr);
          }
          operator_delete(abs_error_expr);
        }
        testing::internal::DoubleNearPredFormat
                  ((char *)CONCAT62(in_stack_ffffffffffffff62,CONCAT11(uVar37,iVar36)),
                   (char *)CONCAT44(in_stack_ffffffffffffff5c,iVar35),(char *)pdVar38,val1,dVar8,
                   (double)this_00);
        if (iVar36 == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffff58);
          pSVar10 = "";
          if (pdVar38 != (double *)0x0) {
            pSVar10 = (SEARCH_METHODS *)*pdVar38;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                     ,0x19d,(char *)pSVar10);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&stack0xffffffffffffff58);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if ((long *)CONCAT44(in_stack_ffffffffffffff5c,iVar35) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff5c,iVar35) + 8))();
          }
        }
        abs_error_expr = pdVar38;
        if (pdVar38 != (double *)0x0) {
          if ((double *)*pdVar38 != pdVar38 + 2) {
            operator_delete((double *)*pdVar38);
          }
          operator_delete(pdVar38);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x10);
      dVar8 = (double)((long)dVar8 + 1);
      local_88 = local_88 + 0x40;
    } while (dVar8 != 7.90505033345994e-323);
    aom_flat_block_finder_extract_block
              (&flat_block_finder,
               (uint8_t *)
               (this_00->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
               _M_impl.super__Vector_impl_data._M_start,0x20,0x20,0x20,0x10,0,local_80,
               in_stack_ffffffffffffff68);
    dVar8 = 128.0 / val1;
    local_88 = 0x20;
    lVar7 = 0;
    do {
      lVar9 = 0;
      do {
        testing::internal::DoubleNearPredFormat
                  ((char *)CONCAT62(in_stack_ffffffffffffff62,CONCAT11(uVar37,iVar36)),
                   (char *)CONCAT44(in_stack_ffffffffffffff5c,iVar35),(char *)abs_error_expr,val1,
                   dVar8,(double)this_00);
        if (iVar36 == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffff58);
          pSVar10 = "";
          if (abs_error_expr != (double *)0x0) {
            pSVar10 = (SEARCH_METHODS *)*abs_error_expr;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                     ,0x1aa,(char *)pSVar10);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&stack0xffffffffffffff58);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if ((long *)CONCAT44(in_stack_ffffffffffffff5c,iVar35) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff5c,iVar35) + 8))();
          }
        }
        pdVar38 = abs_error_expr;
        if (abs_error_expr != (double *)0x0) {
          if ((double *)*abs_error_expr != abs_error_expr + 2) {
            operator_delete((double *)*abs_error_expr);
          }
          operator_delete(abs_error_expr);
        }
        testing::internal::DoubleNearPredFormat
                  ((char *)CONCAT62(in_stack_ffffffffffffff62,CONCAT11(uVar37,iVar36)),
                   (char *)CONCAT44(in_stack_ffffffffffffff5c,iVar35),(char *)pdVar38,val1,dVar8,
                   (double)this_00);
        if (iVar36 == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffff58);
          pSVar10 = "";
          if (pdVar38 != (double *)0x0) {
            pSVar10 = (SEARCH_METHODS *)*pdVar38;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/noise_model_test.cc"
                     ,0x1ab,(char *)pSVar10);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&stack0xffffffffffffff58);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if ((long *)CONCAT44(in_stack_ffffffffffffff5c,iVar35) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffff5c,iVar35) + 8))();
          }
        }
        abs_error_expr = pdVar38;
        if (pdVar38 != (double *)0x0) {
          if ((double *)*pdVar38 != pdVar38 + 2) {
            operator_delete((double *)*pdVar38);
          }
          operator_delete(pdVar38);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x10);
      lVar7 = lVar7 + 1;
      local_88 = local_88 + 0x40;
    } while (lVar7 != 0x10);
    aom_flat_block_finder_free(&flat_block_finder);
    operator_delete(local_80);
  }
  operator_delete(in_stack_ffffffffffffff68);
  return;
}

Assistant:

TYPED_TEST_P(FlatBlockEstimatorTest, ExtractBlock) {
  const int kBlockSize = 16;
  aom_flat_block_finder_t flat_block_finder;
  ASSERT_EQ(1, aom_flat_block_finder_init(&flat_block_finder, kBlockSize,
                                          this->kBitDepth, this->kUseHighBD));
  const double normalization = flat_block_finder.normalization;

  // Test with an image of more than one block.
  const int h = 2 * kBlockSize;
  const int w = 2 * kBlockSize;
  const int stride = 2 * kBlockSize;
  this->data_.resize(h * stride, 128);

  // Set up the (0,0) block to be a plane and the (0,1) block to be a
  // checkerboard
  const int shift = this->kBitDepth - 8;
  for (int y = 0; y < kBlockSize; ++y) {
    for (int x = 0; x < kBlockSize; ++x) {
      this->data_[y * stride + x] = (-y + x + 128) << shift;
      this->data_[y * stride + x + kBlockSize] =
          ((x % 2 + y % 2) % 2 ? 128 - 20 : 128 + 20) << shift;
    }
  }
  std::vector<double> block(kBlockSize * kBlockSize, 1);
  std::vector<double> plane(kBlockSize * kBlockSize, 1);

  // The block data should be a constant (zero) and the rest of the plane
  // trend is covered in the plane data.
  aom_flat_block_finder_extract_block(&flat_block_finder,
                                      (uint8_t *)&this->data_[0], w, h, stride,
                                      0, 0, &plane[0], &block[0]);
  for (int y = 0; y < kBlockSize; ++y) {
    for (int x = 0; x < kBlockSize; ++x) {
      EXPECT_NEAR(0, block[y * kBlockSize + x], 1e-5);
      EXPECT_NEAR((double)(this->data_[y * stride + x]) / normalization,
                  plane[y * kBlockSize + x], 1e-5);
    }
  }

  // The plane trend is a constant, and the block is a zero mean checkerboard.
  aom_flat_block_finder_extract_block(&flat_block_finder,
                                      (uint8_t *)&this->data_[0], w, h, stride,
                                      kBlockSize, 0, &plane[0], &block[0]);
  const int mid = 128 << shift;
  for (int y = 0; y < kBlockSize; ++y) {
    for (int x = 0; x < kBlockSize; ++x) {
      EXPECT_NEAR(((double)this->data_[y * stride + x + kBlockSize] - mid) /
                      normalization,
                  block[y * kBlockSize + x], 1e-5);
      EXPECT_NEAR(mid / normalization, plane[y * kBlockSize + x], 1e-5);
    }
  }
  aom_flat_block_finder_free(&flat_block_finder);
}